

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::BasicTexImageCubeArrayCase::createTexture
          (BasicTexImageCubeArrayCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  int depth;
  int internalFormat;
  deUint32 seed;
  int width;
  int level;
  int ndx;
  long lVar3;
  float fVar4;
  deUint32 tex;
  ContextWrapper *local_d0;
  ulong local_c8;
  TransferFormat local_c0;
  Vec4 gMax;
  Vec4 gMin;
  TextureLevel levelData;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  seed = deStringHash((this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  local_c0 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  local_c8 = (ulong)local_c0 >> 0x20;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(local_c0.format,local_c0.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_d0 = this_00;
  if (0 < (this->super_TextureCubeArraySpecCase).m_numLevels) {
    level = 0;
    do {
      width = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)level & 0x1f);
      if (width < 2) {
        width = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        fVar1 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        fVar2 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[lVar3];
        fVar4 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar3] = (fVar2 - fVar1) * fVar4 + fVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar3 = 0;
      do {
        fVar1 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin.m_data[lVar3];
        fVar2 = (this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax.m_data[lVar3];
        fVar4 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar3] = (fVar2 - fVar1) * fVar4 + fVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      tcu::TextureLevel::setSize
                (&levelData,width,width,(this->super_TextureCubeArraySpecCase).m_depth);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      depth = (this->super_TextureCubeArraySpecCase).m_depth;
      internalFormat = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage3D
                (local_d0,0x9009,level,internalFormat,width,width,depth,0,local_c0.format,
                 (deUint32)local_c8,local_58.super_ConstPixelBufferAccess.m_data);
      level = level + 1;
    } while (level < (this->super_TextureCubeArraySpecCase).m_numLevels);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex			= 0;
		de::Random				rnd			(deStringHash(getName()));
		glu::TransferFormat		transferFmt	= glu::getTransferFormat(m_texFormat);
		tcu::TextureLevel		levelData	(glu::mapGLTransferFormat(transferFmt.format, transferFmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_size	>> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, transferFmt.format, transferFmt.dataType, levelData.getAccess().getDataPtr());
		}
	}